

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<unsigned_char> * __thiscall
kj::ArrayBuilder<unsigned_char>::operator=
          (ArrayBuilder<unsigned_char> *this,ArrayBuilder<unsigned_char> *other)

{
  ArrayBuilder<unsigned_char> *other_local;
  ArrayBuilder<unsigned_char> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (uchar *)0x0;
  other->pos = (RemoveConst<unsigned_char> *)0x0;
  other->endPtr = (uchar *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }